

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_27de14::PeerManagerImpl::HasAllDesirableServiceFlags
          (PeerManagerImpl *this,ServiceFlags services)

{
  long lVar1;
  time_point tVar2;
  ServiceFlags SVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)services >> 10 & 1) != 0) {
    tVar2 = NodeClock::now();
    SVar3 = ~(NODE_NETWORK_LIMITED|NODE_WITNESS);
    if (((long)tVar2.__d.__r / 1000000000 - (this->m_best_block_time)._M_i.__r) /
        (this->m_chainparams->consensus).nPowTargetSpacing < 0x90) goto LAB_001d2e61;
  }
  SVar3 = ~(NODE_WITNESS|NODE_NETWORK);
LAB_001d2e61:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (SVar3 | services) == ~NODE_NONE;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::HasAllDesirableServiceFlags(ServiceFlags services) const
{
    // Shortcut for (services & GetDesirableServiceFlags(services)) == GetDesirableServiceFlags(services)
    return !(GetDesirableServiceFlags(services) & (~services));
}